

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbering.h
# Opt level: O2

void __thiscall wasm::ValueNumbering::~ValueNumbering(ValueNumbering *this)

{
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->expressionValues)._M_h);
  std::
  _Hashtable<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->literalValues)._M_h);
  return;
}

Assistant:

Index getValue(Expression* expr) {
    if (Properties::isConstantExpression(expr)) {
      return getValue(Properties::getLiterals(expr));
    } else {
      auto iter = expressionValues.find(expr);
      if (iter != expressionValues.end()) {
        return iter->second;
      }
      // TODO: full GVN to check for different expressions with the same value.
      return expressionValues[expr] = getUniqueValue();
    }
  }